

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O2

void __thiscall
osqp::anon_unknown_0::TwoDimensionalQpTest_Solves_Test::~TwoDimensionalQpTest_Solves_Test
          (TwoDimensionalQpTest_Solves_Test *this)

{
  TwoDimensionalQpTest::~TwoDimensionalQpTest(&this->super_TwoDimensionalQpTest);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(TwoDimensionalQpTest, Solves) {
  ASSERT_EQ(solver_.Solve(), OsqpExitCode::kOptimal);

  // NOTE(ml): The convergence guarantees don't imply that the error in
  // objective_value() is within kTolerance. To be more precise, we could
  // compute the worst error bound in a kTolerance box around the optimal
  // solution, but 2 * kTolerance works here.
  EXPECT_NEAR(solver_.objective_value(), 1.0 - 0.5 * 0.25 + 0.25 * 0.25,
              2 * kTolerance);
  ExpectElementsAre(solver_.primal_solution(), {1.0, -0.25}, kTolerance);
  ExpectElementsAre(solver_.dual_solution(), {-15.0 / 8.0}, 2 * kTolerance);
}